

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O2

void __thiscall
test::iu_FilePath_x_iutest_x_RemoveExtension_Test::Body
          (iu_FilePath_x_iutest_x_RemoveExtension_Test *this)

{
  iuFilePath *in_R9;
  AssertionResult iutest_ar;
  FilePath path;
  AssertionResult local_210;
  iuCodeMessage local_1e8;
  iuFilePath local_1b8;
  Fixed local_198;
  
  iutest::detail::iuFilePath::iuFilePath(&local_1b8,"test.exe");
  iutest::detail::iuFilePath::RemoveExtension((iuFilePath *)&local_198,&local_1b8,"bin");
  iutest::internal::CmpHelperEQ<char[9],iutest::detail::iuFilePath>
            (&local_210,(internal *)"\"test.exe\"","path.RemoveExtension(\"bin\")","test.exe",
             (char (*) [9])&local_198,in_R9);
  std::__cxx11::string::~string((string *)&local_198);
  if (local_210.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xa8,local_210.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&local_210);
  iutest::detail::iuFilePath::RemoveExtension((iuFilePath *)&local_198,&local_1b8,"exe");
  iutest::internal::CmpHelperEQ<char[5],iutest::detail::iuFilePath>
            (&local_210,(internal *)0x314ae2,"path.RemoveExtension(\"exe\")","test",
             (char (*) [5])&local_198,in_R9);
  std::__cxx11::string::~string((string *)&local_198);
  if (local_210.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xa9,local_210.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&local_210);
  iutest::detail::iuFilePath::RemoveExtension((iuFilePath *)&local_198,&local_1b8,(char *)0x0);
  iutest::internal::CmpHelperEQ<char[5],iutest::detail::iuFilePath>
            (&local_210,(internal *)0x314ae2,"path.RemoveExtension()","test",
             (char (*) [5])&local_198,in_R9);
  std::__cxx11::string::~string((string *)&local_198);
  if (local_210.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xab,local_210.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1b8);
  iutest::detail::iuFilePath::iuFilePath(&local_1b8,"test.exe.bin");
  iutest::detail::iuFilePath::RemoveExtension((iuFilePath *)&local_198,&local_1b8,"bin");
  iutest::internal::CmpHelperEQ<char[9],iutest::detail::iuFilePath>
            (&local_210,(internal *)"\"test.exe\"","path.RemoveExtension(\"bin\")","test.exe",
             (char (*) [9])&local_198,in_R9);
  std::__cxx11::string::~string((string *)&local_198);
  if (local_210.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xb0,local_210.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&local_210);
  iutest::detail::iuFilePath::RemoveExtension((iuFilePath *)&local_198,&local_1b8,"exe");
  iutest::internal::CmpHelperEQ<char[13],iutest::detail::iuFilePath>
            (&local_210,(internal *)"\"test.exe.bin\"","path.RemoveExtension(\"exe\")",
             "test.exe.bin",(char (*) [13])&local_198,in_R9);
  std::__cxx11::string::~string((string *)&local_198);
  if (local_210.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xb1,local_210.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&local_210);
  iutest::detail::iuFilePath::RemoveExtension((iuFilePath *)&local_198,&local_1b8,(char *)0x0);
  iutest::internal::CmpHelperEQ<char[9],iutest::detail::iuFilePath>
            (&local_210,(internal *)"\"test.exe\"","path.RemoveExtension()","test.exe",
             (char (*) [9])&local_198,in_R9);
  std::__cxx11::string::~string((string *)&local_198);
  if (local_210.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xb3,local_210.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1b8);
  iutest::detail::iuFilePath::iuFilePath(&local_1b8,"test");
  iutest::detail::iuFilePath::RemoveExtension((iuFilePath *)&local_198,&local_1b8,"test");
  iutest::internal::CmpHelperEQ<char[5],iutest::detail::iuFilePath>
            (&local_210,(internal *)0x314ae2,"path.RemoveExtension(\"test\")","test",
             (char (*) [5])&local_198,in_R9);
  std::__cxx11::string::~string((string *)&local_198);
  if (local_210.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xb8,local_210.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&local_210);
  iutest::detail::iuFilePath::RemoveExtension((iuFilePath *)&local_198,&local_1b8,"exe");
  iutest::internal::CmpHelperEQ<char[5],iutest::detail::iuFilePath>
            (&local_210,(internal *)0x314ae2,"path.RemoveExtension(\"exe\")","test",
             (char (*) [5])&local_198,in_R9);
  std::__cxx11::string::~string((string *)&local_198);
  if (local_210.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xb9,local_210.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1b8);
  return;
}

Assistant:

IUTEST(FilePath, RemoveExtension)
{
    {
        ::iutest::internal::FilePath path("test.exe");
        IUTEST_EXPECT_EQ("test.exe", path.RemoveExtension("bin"));
        IUTEST_EXPECT_EQ("test", path.RemoveExtension("exe"));
#if !defined(IUTEST_USE_GTEST)
        IUTEST_EXPECT_EQ("test", path.RemoveExtension());
#endif
    }
    {
        ::iutest::internal::FilePath path("test.exe.bin");
        IUTEST_EXPECT_EQ("test.exe", path.RemoveExtension("bin"));
        IUTEST_EXPECT_EQ("test.exe.bin", path.RemoveExtension("exe"));
#if !defined(IUTEST_USE_GTEST)
        IUTEST_EXPECT_EQ("test.exe", path.RemoveExtension());
#endif
    }
    {
        ::iutest::internal::FilePath path("test");
        IUTEST_EXPECT_EQ("test", path.RemoveExtension("test"));
        IUTEST_EXPECT_EQ("test", path.RemoveExtension("exe"));
    }
}